

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationProcessing.hpp
# Opt level: O2

bool isComparisonOperation(string *op)

{
  bool bVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_127;
  allocator<char> local_126;
  allocator<char> local_125;
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"==",&local_121);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"!=",&local_122);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,">=",&local_123);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"<=",&local_124);
  std::__cxx11::string::string<std::allocator<char>>(local_68,">",&local_125);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"<",&local_126);
  __l._M_len = 6;
  __l._M_array = &local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120,__l,&local_127);
  std::__cxx11::string::string((string *)&local_108,op);
  bVar1 = contain<std::__cxx11::string>(&local_120,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  lVar2 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e8._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return bVar1;
}

Assistant:

bool isComparisonOperation(string op) {
	return contain({"==", "!=", ">=", "<=", ">", "<"}, op);
}